

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

PackagePreset * __thiscall
cmake::FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
          (cmake *this,static_string_view type,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
          *presets,WorkflowStep *step)

{
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  PackagePreset *pPVar4;
  char *pcVar5;
  size_t sVar6;
  char local_2b9;
  size_t local_2b8;
  char *pcStack_2b0;
  cmAlphaNum local_2a8;
  cmAlphaNum local_278;
  string local_248;
  size_t local_228;
  char *pcStack_220;
  cmAlphaNum local_210;
  cmAlphaNum local_1e0;
  string local_1b0;
  char local_189;
  size_t local_188;
  char *pcStack_180;
  cmAlphaNum local_170;
  cmAlphaNum local_140;
  string local_110;
  char local_d9;
  size_t local_d8;
  char *pcStack_d0;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  string local_68;
  _Self local_48;
  _Self local_40;
  const_iterator it;
  WorkflowStep *step_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *presets_local;
  cmake *this_local;
  static_string_view type_local;
  
  pcVar5 = type.super_string_view._M_str;
  sVar6 = type.super_string_view._M_len;
  it._M_node = (_Base_ptr)step;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
       ::find(presets,&step->PresetName);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
       ::end(presets);
  bVar1 = std::operator==(&local_40,&local_48);
  if (bVar1) {
    cmAlphaNum::cmAlphaNum(&local_98,"No such ");
    local_d8 = sVar6;
    pcStack_d0 = pcVar5;
    cmAlphaNum::cmAlphaNum(&local_c8,type.super_string_view);
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    local_d9 = '\"';
    cmStrCat<char[12],std::__cxx11::string,char[4],std::__cxx11::string,char>
              (&local_68,&local_98,&local_c8,(char (*) [12])0xd3efb7,psVar3,(char (*) [4])0xd61fed,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(it._M_node)->_M_parent,&local_d9);
    cmSystemTools::Error(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    type_local.super_string_view._M_str = (char *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
             ::operator->(&local_40);
    if (((ppVar2->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
               ::operator->(&local_40);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&(ppVar2->second).Expanded);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
                 ::operator->(&local_40);
        pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->
                           (&(ppVar2->second).Expanded);
        if (((pPVar4->super_Preset).ConditionResult & 1U) == 0) {
          cmAlphaNum::cmAlphaNum(&local_278,"Cannot use disabled ");
          local_2b8 = sVar6;
          pcStack_2b0 = pcVar5;
          cmAlphaNum::cmAlphaNum(&local_2a8,type.super_string_view);
          psVar3 = GetHomeDirectory_abi_cxx11_(this);
          local_2b9 = '\"';
          cmStrCat<char[12],std::__cxx11::string,char[4],std::__cxx11::string,char>
                    (&local_248,&local_278,&local_2a8,(char (*) [12])0xd3efb7,psVar3,
                     (char (*) [4])0xd61fed,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(it._M_node)->_M_parent,&local_2b9);
          cmSystemTools::Error(&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          type_local.super_string_view._M_str = (char *)0x0;
        }
        else {
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
                   ::operator->(&local_40);
          type_local.super_string_view._M_str =
               (char *)std::optional<cmCMakePresetsGraph::PackagePreset>::operator*
                                 (&(ppVar2->second).Expanded);
        }
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_1e0,"Could not evaluate ");
        local_228 = sVar6;
        pcStack_220 = pcVar5;
        cmAlphaNum::cmAlphaNum(&local_210,type.super_string_view);
        cmStrCat<char[10],std::__cxx11::string,char[27]>
                  (&local_1b0,&local_1e0,&local_210,(char (*) [10])0xd3dfe6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(it._M_node)->_M_parent,(char (*) [27])"\": Invalid macro expansion");
        cmSystemTools::Error(&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        type_local.super_string_view._M_str = (char *)0x0;
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_140,"Cannot use hidden ");
      local_188 = sVar6;
      pcStack_180 = pcVar5;
      cmAlphaNum::cmAlphaNum(&local_170,type.super_string_view);
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      local_189 = '\"';
      cmStrCat<char[12],std::__cxx11::string,char[4],std::__cxx11::string,char>
                (&local_110,&local_140,&local_170,(char (*) [12])0xd3efb7,psVar3,
                 (char (*) [4])0xd61fed,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(it._M_node)->_M_parent,&local_189);
      cmSystemTools::Error(&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      type_local.super_string_view._M_str = (char *)0x0;
    }
  }
  return (PackagePreset *)type_local.super_string_view._M_str;
}

Assistant:

const T* cmake::FindPresetForWorkflow(
  cm::static_string_view type,
  const std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  const cmCMakePresetsGraph::WorkflowPreset::WorkflowStep& step)
{
  auto it = presets.find(step.PresetName);
  if (it == presets.end()) {
    cmSystemTools::Error(cmStrCat("No such ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (it->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (!it->second.Expanded) {
    cmSystemTools::Error(cmStrCat("Could not evaluate ", type, " preset \"",
                                  step.PresetName,
                                  "\": Invalid macro expansion"));
    return nullptr;
  }

  if (!it->second.Expanded->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  return &*it->second.Expanded;
}